

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O2

Array<float,_NUM_EDGES>
Rml::ElementHandleTargetData::ResolveEdgeMargin
          (Element *target,Box *box,Array<NumericValue,_NUM_EDGES> *edge_margin)

{
  int i;
  long lVar1;
  float fVar2;
  Array<float,_NUM_EDGES> AVar3;
  Array<float,_NUM_EDGES> resolved_edge_margin;
  Vector2f target_size;
  
  target_size = Box::GetSize(box,Border);
  resolved_edge_margin._M_elems[0] = 0.0;
  resolved_edge_margin._M_elems[1] = 0.0;
  resolved_edge_margin._M_elems[2] = 0.0;
  resolved_edge_margin._M_elems[3] = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    fVar2 = -3.4028235e+38;
    if (edge_margin->_M_elems[lVar1].unit != UNKNOWN) {
      fVar2 = Element::ResolveNumericValue
                        (target,edge_margin->_M_elems[lVar1],(&target_size.x)[~(uint)lVar1 & 1]);
      fVar2 = Math::Round(fVar2);
    }
    resolved_edge_margin._M_elems[lVar1] = fVar2;
  }
  AVar3._M_elems[0] = resolved_edge_margin._M_elems[0];
  AVar3._M_elems[1] = resolved_edge_margin._M_elems[1];
  AVar3._M_elems[2] = resolved_edge_margin._M_elems[2];
  AVar3._M_elems[3] = resolved_edge_margin._M_elems[3];
  return (Array<float,_NUM_EDGES>)AVar3._M_elems;
}

Assistant:

static Array<float, NUM_EDGES> ResolveEdgeMargin(Element* target, const Box& box, const Array<NumericValue, NUM_EDGES>& edge_margin)
	{
		const Vector2f target_size = box.GetSize(BoxArea::Border);
		Array<float, NUM_EDGES> resolved_edge_margin = {};
		for (int i = 0; i < NUM_EDGES; i++)
		{
			resolved_edge_margin[i] = (edge_margin[i].unit == Unit::UNKNOWN
					? -FLT_MAX
					: Math::Round(target->ResolveNumericValue(edge_margin[i], target_size[(i == LEFT || i == RIGHT) ? 0 : 1])));
		}
		return resolved_edge_margin;
	}